

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

JSON __thiscall
QPDFObjectHandle::getJSON(QPDFObjectHandle *this,int json_version,bool dereference_indirect)

{
  element_type *peVar1;
  logic_error *this_00;
  int in_ECX;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined4 in_register_00000034;
  QPDFObjectHandle *this_01;
  JSON JVar3;
  Pl_Buffer p;
  Writer jw;
  string local_98;
  undefined1 local_78 [56];
  Writer local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  this_01 = (QPDFObjectHandle *)CONCAT44(in_register_00000034,json_version);
  peVar1 = (this_01->super_BaseHandle).obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (in_ECX == 0) {
    if (peVar1 == (element_type *)0x0) goto LAB_001c66c2;
    if ((peVar1->og).obj != 0) {
      unparse_abi_cxx11_((string *)local_78,this_01);
      JVar3 = JSON::makeString((JSON *)this,(string *)local_78);
      _Var2._M_pi = JVar3.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
        _Var2._M_pi = extraout_RDX;
      }
      goto LAB_001c66b2;
    }
  }
  else if (peVar1 == (element_type *)0x0) {
LAB_001c66c2:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"attempted to dereference an uninitialized QPDFObjectHandle");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  Pl_Buffer::Pl_Buffer((Pl_Buffer *)local_78,"json",(Pipeline *)0x0);
  local_40.first = true;
  local_40.indent = 0;
  local_40.p = (Pipeline *)local_78;
  writeJSON(this_01,(int)CONCAT71(in_register_00000011,dereference_indirect),&local_40,
            SUB41(in_ECX,0));
  Pl_Buffer::finish((Pl_Buffer *)local_78);
  Pl_Buffer::getString_abi_cxx11_(&local_98,(Pl_Buffer *)local_78);
  JSON::parse((JSON *)this,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  Pl_Buffer::~Pl_Buffer((Pl_Buffer *)local_78);
  _Var2._M_pi = extraout_RDX_00;
LAB_001c66b2:
  JVar3.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  JVar3.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar3.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
QPDFObjectHandle::getJSON(int json_version, bool dereference_indirect) const
{
    if ((!dereference_indirect) && isIndirect()) {
        return JSON::makeString(unparse());
    } else if (!obj) {
        throw std::logic_error("attempted to dereference an uninitialized QPDFObjectHandle");
    } else {
        Pl_Buffer p{"json"};
        JSON::Writer jw{&p, 0};
        writeJSON(json_version, jw, dereference_indirect);
        p.finish();
        return JSON::parse(p.getString());
    }
}